

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriter.cpp
# Opt level: O0

uint64_t __thiscall
MILBlob::Blob::FileWriter::AppendData
          (FileWriter *this,Span<const_unsigned_char,_18446744073709551615UL> data)

{
  uint64_t uVar1;
  pointer ptVar2;
  ulong uVar3;
  runtime_error *this_00;
  uint64_t offset;
  FileWriter *this_local;
  Span<const_unsigned_char,_18446744073709551615UL> data_local;
  
  data_local.m_ptr = (pointer)data.m_size.m_size;
  this_local = (FileWriter *)data.m_ptr;
  uVar1 = GetNextAlignedOffset(this);
  std::ostream::seekp((long)&this->field_0x10,(_Ios_Seekdir)uVar1);
  ptVar2 = Util::Span<const_unsigned_char,_18446744073709551615UL>::Data
                     ((Span<const_unsigned_char,_18446744073709551615UL> *)&this_local);
  Util::Span<const_unsigned_char,_18446744073709551615UL>::Size
            ((Span<const_unsigned_char,_18446744073709551615UL> *)&this_local);
  std::ostream::write(&this->field_0x10,(long)ptVar2);
  uVar3 = std::ios::good();
  if ((uVar3 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"[MIL FileWriter]: Unknown error occurred while writing data to the file.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return uVar1;
}

Assistant:

uint64_t FileWriter::AppendData(Span<const uint8_t> data)
{
    auto offset = GetNextAlignedOffset();
    m_fileStream.seekp(static_cast<std::streamoff>(offset), std::ios::beg);
    m_fileStream.write(reinterpret_cast<const char*>(data.Data()), static_cast<std::streamsize>(data.Size()));
    MILVerifyIsTrue(m_fileStream.good(),
                    std::runtime_error,
                    "[MIL FileWriter]: Unknown error occurred while writing data to the file.");
    return offset;
}